

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalForcesContIntNoDamping
          (ChElementBeamANCF_3243 *this,ChVectorDynamic<> *Fi)

{
  PointerType pdVar1;
  PointerType pdVar2;
  RhsNested pMVar3;
  double dVar4;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar5;
  RhsNested pMVar6;
  Map<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_0,_Eigen::Stride<0,_0>_> QiReshaped;
  VectorNIP_Dv SPK2_1_Block_Dv;
  MatrixNx3 QiCompact;
  VectorNIP_Dv SPK2_3_Block_Dv;
  VectorNIP_Dv SPK2_2_Block_Dv;
  VectorNIP_Dv E2_Block_Dv;
  VectorNIP_Dv E1_Block_Dv;
  VectorNIP_D0 SPK2_5_Block_D0;
  VectorNIP_D0 SPK2_4_Block_D0;
  VectorNIP_Dv E3_Block_Dv;
  VectorNIP_D0 SPK2_6_Block_D0;
  VectorNIP_D0 SPK2_3_Block_D0;
  VectorNIP_D0 SPK2_2_Block_D0;
  VectorNIP_D0 SPK2_1_Block_D0;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  ChMatrixNMc<double,_3_*_NIP,_3> FC;
  Matrix3xN e_bar;
  undefined1 local_f40 [16];
  MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *local_f30;
  variable_if_dynamic<long,__1> local_f28;
  variable_if_dynamic<long,__1> vStack_f20;
  Index local_f18;
  double local_f00;
  RhsNested local_ef8;
  MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *local_ee0;
  ChVectorDynamic<> *local_ed8;
  __shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *local_ed0;
  Matrix<double,__1,__1,_0,__1,__1> *local_ec8;
  double local_ec0;
  double local_eb8;
  double local_eb0;
  double local_ea8;
  double local_ea0;
  double local_e98;
  double local_e90;
  double local_e88;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_e80;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_e58 [24];
  undefined1 local_e40 [16];
  variable_if_dynamic<long,__1> local_e30;
  scalar_constant_op<double> local_e28;
  RhsNested local_e20;
  variable_if_dynamic<long,__1> local_e18;
  variable_if_dynamic<long,__1> vStack_e10;
  Index local_e08;
  RhsNested local_e00;
  PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *local_df0;
  undefined8 local_de8;
  PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *local_de0;
  variable_if_dynamic<long,__1> local_dd8;
  variable_if_dynamic<long,__1> local_dd0;
  scalar_constant_op<double> local_dc8;
  Matrix<double,_12,_1,_0,_12,_1> *local_dc0;
  PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *local_db8;
  undefined8 local_db0;
  PointerType local_da8;
  undefined8 local_da0;
  PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *local_d98;
  variable_if_dynamic<long,__1> local_d90;
  variable_if_dynamic<long,__1> local_d88;
  Index local_d80;
  RhsNested local_d78;
  undefined8 local_d70;
  undefined1 *local_d58;
  PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *local_d48;
  undefined8 local_d40;
  undefined8 local_d38;
  undefined8 local_d30;
  undefined1 *local_d28;
  PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *local_d18;
  undefined8 local_d10;
  undefined8 local_d08;
  undefined8 local_d00;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_ce0 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_cc8 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_cb0 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_c98 [24];
  Matrix<double,_12,_1,_0,_12,_1> local_c80;
  Matrix<double,_12,_1,_0,_12,_1> local_c20;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_ba8 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_b90;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_b68;
  Matrix<double,_12,_1,_0,_12,_1> local_b40;
  undefined1 local_ae0 [96];
  undefined1 local_a80 [96];
  undefined1 local_a20 [112];
  Matrix<double,_45,_3,_0,_45,_3> local_9b0;
  PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> local_578 [96];
  Matrix<double,_3,_1,_0,_3,_1> local_518 [4];
  double local_4b8 [12];
  undefined1 local_458 [24];
  undefined1 local_440 [24];
  undefined1 local_428 [216];
  double local_350 [12];
  undefined1 local_2f0 [24];
  undefined1 local_2d8 [24];
  undefined1 local_2c0 [216];
  double local_1e8 [12];
  undefined1 local_188 [48];
  undefined1 local_158 [296];
  
  local_f40._8_8_ = local_f40._0_8_;
  local_ed8 = Fi;
  CalcCoordMatrix(this,(Matrix3xN *)(local_158 + 0x18));
  local_ee0 = (MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->m_SD;
  local_e40._0_8_ = local_ee0;
  local_a20._0_8_ = (Matrix3xN *)(local_158 + 0x18);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array.
  _0_16_ = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                     ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)local_e40
                      ,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_> *)
                       local_a20);
  Eigen::PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Transpose<Eigen::Matrix<double,3,8,1,3,8>>,0>>
            (local_578,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>,_0>_>
              *)&local_9b0);
  local_ed0 = &(this->m_material).
               super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)&local_9b0
             ,local_ed0);
  dVar4 = local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
          array[0];
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.
              m_data.array + 1));
  pdVar1 = (PointerType)(local_428 + 0x18);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[5]
       = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  pdVar2 = (PointerType)(local_2c0 + 0x18);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[7]
       = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[2]
       = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[4]
       = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[8]
       = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pdVar1;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)pdVar1;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pdVar2;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)pdVar2;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_578;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_a20,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
              *)&local_9b0);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[0]
       = (double)&DAT_3ff0000000000000;
  local_e40._0_8_ = (element_type *)local_a20;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_e40,
             (Scalar *)&local_9b0);
  local_e40._0_8_ =
       (double)(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)dVar4)->m_storage).
               m_cols * 0.5;
  pMVar5 = &this->m_kGQ_D0;
  local_a80._0_8_ = pMVar5;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_9b0,(double *)local_e40,(StorageBaseType *)local_a80);
  local_ae0._0_8_ = (element_type *)local_a20;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_ae0,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_9b0);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[2]
       = (double)local_518;
  pMVar3 = (RhsNested)(local_428 + 0x78);
  pMVar6 = (RhsNested)(local_2c0 + 0x78);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[5]
       = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[7]
       = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[4]
       = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[8]
       = local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
         array[2];
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pMVar3;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)pMVar3;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pMVar6;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)pMVar6;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_578;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_a80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
              *)&local_9b0);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[0]
       = (double)&DAT_3ff0000000000000;
  local_e40._0_8_ = (element_type *)local_a80;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_e40,
             (Scalar *)&local_9b0);
  local_e40._0_8_ =
       (double)(((non_const_type)((long)dVar4 + 0x18))->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_data *
       0.5;
  local_ae0._0_8_ = pMVar5;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_9b0,(double *)local_e40,(StorageBaseType *)local_ae0);
  local_c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[0]
       = (double)local_a80;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)&local_c20,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_9b0);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[5]
       = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[7]
       = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[2]
       = (double)local_4b8;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[4]
       = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[8]
       = (double)local_4b8;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)local_350;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)local_350;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)local_1e8;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)local_1e8;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_578;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_ae0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
              *)&local_9b0);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[0]
       = (double)&DAT_3ff0000000000000;
  local_e40._0_8_ = (element_type *)local_ae0;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_e40,
             (Scalar *)&local_9b0);
  local_e40._0_8_ =
       (double)(((non_const_type)((long)dVar4 + 0x18))->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows *
       0.5;
  local_c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[0]
       = (double)pMVar5;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_9b0,(double *)local_e40,(StorageBaseType *)&local_c20);
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[0]
       = (double)local_ae0;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)&local_c80,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_9b0);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[2]
       = (double)local_518;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[5]
       = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[7]
       = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[4]
       = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[8]
       = (double)local_4b8;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pMVar3;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)local_350;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pMVar6;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)local_1e8;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_578;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_c20,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
              *)&local_9b0);
  local_e40._0_8_ = pMVar5;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_9b0,
                   (double *)
                   &(((non_const_type)((long)dVar4 + 0x18))->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                    m_cols,(StorageBaseType *)local_e40);
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[0]
       = (double)&local_c20;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)&local_c80,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_9b0);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[5]
       = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[7]
       = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[2]
       = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[4]
       = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[8]
       = (double)local_4b8;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pdVar1;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)local_350;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pdVar2;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)local_1e8;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_578;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_c80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
              *)&local_9b0);
  local_e40._0_8_ = pMVar5;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_9b0,(double *)((long)dVar4 + 0x30),(StorageBaseType *)local_e40);
  local_b40.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array[0]
       = (double)&local_c80;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)&local_b40,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_9b0);
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[8]
       = (double)local_518;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[5]
       = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[7]
       = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[2]
       = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[4]
       = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pdVar1;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)pMVar3;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pdVar2;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_578;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)pMVar6;
  local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_578;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_b40,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
              *)&local_9b0);
  local_e40._0_8_ = pMVar5;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_9b0,
                   (double *)
                   &(((non_const_type)((long)dVar4 + 0x30))->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                    m_rows,(StorageBaseType *)local_e40);
  local_f40._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_b40;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_f40,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_9b0);
  local_df0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)local_518;
  local_e18.m_value = 0;
  vStack_e10.m_value = 0;
  local_e08 = 0x2d;
  local_dd8.m_value = 0xc;
  local_dd0.m_value = 0;
  local_dc0 = &local_b40;
  local_dc8.m_other = 2.22329540628561e-322;
  local_d90.m_value = 0x18;
  local_d88.m_value = 0;
  local_d78 = &local_c80;
  local_d80 = 0x2d;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_f28.m_value = 0;
  vStack_f20.m_value = 0;
  local_f18 = 0x2d;
  local_e30.m_value = (long)local_578;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_e00 = (RhsNested)local_a20;
  local_de0 = local_578;
  local_da8 = local_4b8;
  local_d98 = local_578;
  local_f40._0_8_ = local_f30;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_e40);
  local_e18.m_value = 0;
  vStack_e10.m_value = 1;
  local_e08 = 0x2d;
  local_dc0 = &local_b40;
  local_dd8.m_value = 0xc;
  local_dd0.m_value = 1;
  local_dc8.m_other = 2.22329540628561e-322;
  local_d78 = &local_c80;
  local_d90.m_value = 0x18;
  local_d88.m_value = 1;
  local_d80 = 0x2d;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x2d;
  local_f28.m_value = 0;
  vStack_f20.m_value = 1;
  local_f18 = 0x2d;
  local_e30.m_value = (long)pdVar1;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_e00 = (RhsNested)local_a20;
  local_df0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)pMVar3;
  local_de0 = local_578;
  local_da8 = local_350;
  local_d98 = local_578;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_e40);
  local_e18.m_value = 0;
  local_e00 = (RhsNested)local_a20;
  vStack_e10.m_value = 2;
  local_e08 = 0x2d;
  local_dd8.m_value = 0xc;
  local_dd0.m_value = 2;
  local_dc8.m_other = 2.22329540628561e-322;
  local_d78 = &local_c80;
  local_d90.m_value = 0x18;
  local_d88.m_value = 2;
  local_d80 = 0x2d;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x5a;
  local_f28.m_value = 0;
  vStack_f20.m_value = 2;
  local_f18 = 0x2d;
  local_e30.m_value = (long)pdVar2;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_df0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)pMVar6;
  local_de0 = local_578;
  local_dc0 = &local_b40;
  local_da8 = local_1e8;
  local_d98 = local_578;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_e40);
  local_df0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)local_518;
  local_e18.m_value = 0;
  vStack_e10.m_value = 0;
  local_e08 = 0x2d;
  local_dd8.m_value = 0xc;
  local_dd0.m_value = 0;
  local_dc0 = (Matrix<double,_12,_1,_0,_12,_1> *)local_a80;
  local_dc8.m_other = 2.22329540628561e-322;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0xc;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_d90.m_value = 0x18;
  local_d88.m_value = 0;
  local_d80 = 0x2d;
  local_f28.m_value = 0xc;
  vStack_f20.m_value = 0;
  local_f18 = 0x2d;
  local_e30.m_value = (long)local_578;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_e00 = &local_b40;
  local_de0 = local_578;
  local_da8 = local_4b8;
  local_d98 = local_578;
  local_d78 = &local_c20;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_e40);
  local_e18.m_value = 0;
  local_e00 = &local_b40;
  vStack_e10.m_value = 1;
  local_e08 = 0x2d;
  local_dc0 = (Matrix<double,_12,_1,_0,_12,_1> *)local_a80;
  local_dd8.m_value = 0xc;
  local_dd0.m_value = 1;
  local_dc8.m_other = 2.22329540628561e-322;
  local_d90.m_value = 0x18;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_d88.m_value = 1;
  local_d80 = 0x2d;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x39;
  local_f28.m_value = 0xc;
  vStack_f20.m_value = 1;
  local_f18 = 0x2d;
  local_e30.m_value = (long)pdVar1;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_df0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)pMVar3;
  local_de0 = local_578;
  local_da8 = local_350;
  local_d98 = local_578;
  local_d78 = &local_c20;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_e40);
  local_e18.m_value = 0;
  local_e00 = &local_b40;
  local_dc0 = (Matrix<double,_12,_1,_0,_12,_1> *)local_a80;
  vStack_e10.m_value = 2;
  local_e08 = 0x2d;
  local_dd8.m_value = 0xc;
  local_dd0.m_value = 2;
  local_dc8.m_other = 2.22329540628561e-322;
  local_d90.m_value = 0x18;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_d88.m_value = 2;
  local_d80 = 0x2d;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x66;
  local_f28.m_value = 0xc;
  vStack_f20.m_value = 2;
  local_f18 = 0x2d;
  local_e30.m_value = (long)pdVar2;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_df0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)pMVar6;
  local_de0 = local_578;
  local_da8 = local_1e8;
  local_d98 = local_578;
  local_d78 = &local_c20;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_e40);
  local_e00 = &local_c80;
  local_df0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)local_518;
  local_e18.m_value = 0;
  vStack_e10.m_value = 0;
  local_e08 = 0x2d;
  local_dd8.m_value = 0xc;
  local_dd0.m_value = 0;
  local_dc8.m_other = 2.22329540628561e-322;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_d90.m_value = 0x18;
  local_d88.m_value = 0;
  local_d80 = 0x2d;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x18;
  local_f28.m_value = 0x18;
  vStack_f20.m_value = 0;
  local_f18 = 0x2d;
  local_e30.m_value = (long)local_578;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_de0 = local_578;
  local_dc0 = &local_c20;
  local_da8 = local_4b8;
  local_d98 = local_578;
  local_d78 = (RhsNested)local_ae0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_e40);
  local_e18.m_value = 0;
  local_e00 = &local_c80;
  vStack_e10.m_value = 1;
  local_e08 = 0x2d;
  local_dc0 = &local_c20;
  local_dd8.m_value = 0xc;
  local_dd0.m_value = 1;
  local_dc8.m_other = 2.22329540628561e-322;
  local_d90.m_value = 0x18;
  local_d88.m_value = 1;
  local_d80 = 0x2d;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x45;
  local_f28.m_value = 0x18;
  vStack_f20.m_value = 1;
  local_f18 = 0x2d;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_e30.m_value = (long)pdVar1;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_df0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)pMVar3;
  local_de0 = local_578;
  local_da8 = local_350;
  local_d98 = local_578;
  local_d78 = (RhsNested)local_ae0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_e40);
  local_e18.m_value = 0;
  local_e00 = &local_c80;
  vStack_e10.m_value = 2;
  local_e08 = 0x2d;
  local_dd8.m_value = 0xc;
  local_dc0 = &local_c20;
  local_dd0.m_value = 2;
  local_dc8.m_other = 2.22329540628561e-322;
  local_d78 = (RhsNested)local_ae0;
  local_d90.m_value = 0x18;
  local_d88.m_value = 2;
  local_d80 = 0x2d;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x72;
  local_f28.m_value = 0x18;
  vStack_f20.m_value = 2;
  local_f18 = 0x2d;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_e30.m_value = (long)pdVar2;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_df0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)pMVar6;
  local_de0 = local_578;
  local_da8 = local_1e8;
  local_d98 = local_578;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_e40);
  local_e30.m_value = (long)local_458;
  local_dc8.m_other = (double)local_2f0;
  local_d58 = local_188;
  local_e18.m_value = 0x24;
  vStack_e10.m_value = 0;
  local_e08 = 0x2d;
  local_de8 = 0x24;
  local_de0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)0x0;
  local_dd8.m_value = 0x2d;
  local_db0 = 0x24;
  local_da8 = (PointerType)0x1;
  local_da0 = 0x2d;
  local_d80 = 0x24;
  local_d78 = (RhsNested)0x1;
  local_d70 = 0x2d;
  local_d40 = 0x24;
  local_d38 = 2;
  local_d30 = 0x2d;
  local_d10 = 0x24;
  local_d08 = 2;
  local_d00 = 0x2d;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_e00 = (RhsNested)local_e30.m_value;
  local_df0 = local_578;
  local_db8 = local_578;
  local_d98 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)local_dc8.m_other;
  local_d88.m_value = (long)local_578;
  local_d48 = local_578;
  local_d28 = local_d58;
  local_d18 = local_578;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const>const>>
            (local_c98,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>_>
              *)local_e40);
  local_e40._0_8_ = &DAT_3ff0000000000000;
  local_f40._0_8_ = local_c98;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_f40,
             (Scalar *)local_e40);
  local_f40._0_8_ = (PointerType)0x3fe0000000000000;
  pMVar5 = &this->m_kGQ_Dv;
  local_ec8 = pMVar5;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_e40,(double *)local_f40,(StorageBaseType *)&local_ec8);
  local_e80._0_8_ = local_c98;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)&local_e80,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_e40);
  local_e30.m_value = (long)local_440;
  local_dc8.m_other = (double)local_2d8;
  local_d58 = local_188 + 0x18;
  local_e18.m_value = 0x27;
  vStack_e10.m_value = 0;
  local_e08 = 0x2d;
  local_de8 = 0x27;
  local_de0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)0x0;
  local_dd8.m_value = 0x2d;
  local_db0 = 0x27;
  local_da8 = (PointerType)0x1;
  local_da0 = 0x2d;
  local_d80 = 0x27;
  local_d78 = (RhsNested)0x1;
  local_d70 = 0x2d;
  local_d40 = 0x27;
  local_d38 = 2;
  local_d30 = 0x2d;
  local_d10 = 0x27;
  local_d08 = 2;
  local_d00 = 0x2d;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_e00 = (RhsNested)local_e30.m_value;
  local_df0 = local_578;
  local_db8 = local_578;
  local_d98 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)local_dc8.m_other;
  local_d88.m_value = (long)local_578;
  local_d48 = local_578;
  local_d28 = local_d58;
  local_d18 = local_578;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const>const>>
            (local_cb0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>_>
              *)local_e40);
  local_e40._0_8_ = &DAT_3ff0000000000000;
  local_f40._0_8_ = local_cb0;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_f40,
             (Scalar *)local_e40);
  local_f40._0_8_ = (PointerType)0x3fe0000000000000;
  local_ec8 = pMVar5;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_e40,(double *)local_f40,(StorageBaseType *)&local_ec8);
  local_e80._0_8_ = local_cb0;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)&local_e80,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_e40);
  local_e30.m_value = (long)local_428;
  local_dc8.m_other = (double)local_2c0;
  local_d58 = local_158;
  local_e18.m_value = 0x2a;
  vStack_e10.m_value = 0;
  local_e08 = 0x2d;
  local_de8 = 0x2a;
  local_de0 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)0x0;
  local_dd8.m_value = 0x2d;
  local_db0 = 0x2a;
  local_da8 = (PointerType)0x1;
  local_da0 = 0x2d;
  local_d80 = 0x2a;
  local_d78 = (RhsNested)0x1;
  local_d70 = 0x2d;
  local_d40 = 0x2a;
  local_d38 = 2;
  local_d30 = 0x2d;
  local_d10 = 0x2a;
  local_d08 = 2;
  local_d00 = 0x2d;
  local_e20.m_expression = (NestedExpressionType)local_578;
  local_e00 = (RhsNested)local_e30.m_value;
  local_df0 = local_578;
  local_db8 = local_578;
  local_d98 = (PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)local_dc8.m_other;
  local_d88.m_value = (long)local_578;
  local_d48 = local_578;
  local_d28 = local_d58;
  local_d18 = local_578;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const>const>>
            (local_ba8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>_>
              *)local_e40);
  local_e40._0_8_ = &DAT_3ff0000000000000;
  local_f40._0_8_ = local_ba8;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_f40,
             (Scalar *)local_e40);
  local_f40._0_8_ = (PointerType)0x3fe0000000000000;
  local_ec8 = pMVar5;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_e40,(double *)local_f40,(StorageBaseType *)&local_ec8);
  local_e80._0_8_ = local_ba8;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)&local_e80,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_e40);
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)local_e40,
             local_ed0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Matrix<double,3,3,1,3,3>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_ec8,
             (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)(local_e40._0_8_ + 0x40));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e40 + 8));
  Eigen::operator*(&local_e80,(double *)&local_ec8,(StorageBaseType *)local_c98);
  Eigen::operator*(&local_b68,&local_ec0,(StorageBaseType *)local_cb0);
  local_f28.m_value = (long)local_e80.m_lhs.m_functor.m_other;
  vStack_f20.m_value = (long)local_e80.m_rhs;
  local_f00 = local_b68.m_lhs.m_functor.m_other;
  local_ef8 = local_b68.m_rhs;
  Eigen::operator*(&local_b90,&local_eb8,(StorageBaseType *)local_ba8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_e40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_f40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_b90);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_e58,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_e40);
  Eigen::operator*(&local_e80,&local_eb0,(StorageBaseType *)local_c98);
  Eigen::operator*(&local_b68,&local_ea8,(StorageBaseType *)local_cb0);
  local_f28.m_value = (long)local_e80.m_lhs.m_functor.m_other;
  vStack_f20.m_value = (long)local_e80.m_rhs;
  local_f00 = local_b68.m_lhs.m_functor.m_other;
  local_ef8 = local_b68.m_rhs;
  Eigen::operator*(&local_b90,&local_ea0,(StorageBaseType *)local_ba8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_e40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_f40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_b90);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_cc8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_e40);
  Eigen::operator*(&local_e80,&local_e98,(StorageBaseType *)local_c98);
  Eigen::operator*(&local_b68,&local_e90,(StorageBaseType *)local_cb0);
  local_f28.m_value = (long)local_e80.m_lhs.m_functor.m_other;
  vStack_f20.m_value = (long)local_e80.m_rhs;
  local_f00 = local_b68.m_lhs.m_functor.m_other;
  local_ef8 = local_b68.m_rhs;
  Eigen::operator*(&local_b90,&local_e88,(StorageBaseType *)local_ba8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_e40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_f40,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_b90);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_ce0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_e40);
  local_e40._0_8_ = local_458;
  local_e30.m_value = (long)local_578;
  local_e28.m_other = 1.77863632502849e-322;
  local_e20.m_expression = (NestedExpressionType)0x0;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x24;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  vStack_e10.m_value = (long)local_e58;
  local_e18.m_value = 0x2d;
  local_f28.m_value = 0x24;
  vStack_f20.m_value = 0;
  local_f18 = 0x2d;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_e40);
  local_e40._0_8_ = local_2f0;
  local_e28.m_other = 1.77863632502849e-322;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x51;
  vStack_e10.m_value = (long)local_e58;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_e20.m_expression = (NestedExpressionType)0x1;
  local_e18.m_value = 0x2d;
  local_f28.m_value = 0x24;
  vStack_f20.m_value = 1;
  local_f18 = 0x2d;
  local_e30.m_value = (long)local_578;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_e40);
  local_e40._0_8_ = local_188;
  local_e28.m_other = 1.77863632502849e-322;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x7e;
  vStack_e10.m_value = (long)local_e58;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_e20.m_expression = (NestedExpressionType)0x2;
  local_e18.m_value = 0x2d;
  local_f28.m_value = 0x24;
  vStack_f20.m_value = 2;
  local_f18 = 0x2d;
  local_e30.m_value = (long)local_578;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_e40);
  local_e40._0_8_ = local_440;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x27;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_e28.m_other = 1.92685601878086e-322;
  local_e20.m_expression = (NestedExpressionType)0x0;
  local_e18.m_value = 0x2d;
  local_f28.m_value = 0x27;
  vStack_f20.m_value = 0;
  local_f18 = 0x2d;
  local_e30.m_value = (long)local_578;
  vStack_e10.m_value = (long)local_cc8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_e40);
  local_e40._0_8_ = local_2d8;
  local_e30.m_value = (long)local_578;
  local_e28.m_other = 1.92685601878086e-322;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x54;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_e20.m_expression = (NestedExpressionType)0x1;
  local_e18.m_value = 0x2d;
  local_f28.m_value = 0x27;
  vStack_f20.m_value = 1;
  local_f18 = 0x2d;
  vStack_e10.m_value = (long)local_cc8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_e40);
  local_e40._0_8_ = local_188 + 0x18;
  local_e28.m_other = 1.92685601878086e-322;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x81;
  vStack_e10.m_value = (long)local_cc8;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_e20.m_expression = (NestedExpressionType)0x2;
  local_e18.m_value = 0x2d;
  local_f28.m_value = 0x27;
  vStack_f20.m_value = 2;
  local_f18 = 0x2d;
  local_e30.m_value = (long)local_578;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_e40);
  local_e40._0_8_ = local_428;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x2a;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  local_e28.m_other = 2.07507571253324e-322;
  local_e20.m_expression = (NestedExpressionType)0x0;
  local_e18.m_value = 0x2d;
  local_f28.m_value = 0x2a;
  vStack_f20.m_value = 0;
  local_f18 = 0x2d;
  local_e30.m_value = (long)local_578;
  vStack_e10.m_value = (long)local_ce0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_e40);
  local_e40._0_8_ = local_2c0;
  local_e30.m_value = (long)local_578;
  local_e28.m_other = 2.07507571253324e-322;
  local_e20.m_expression = (NestedExpressionType)0x1;
  local_e18.m_value = 0x2d;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x57;
  local_f28.m_value = 0x2a;
  vStack_f20.m_value = 1;
  local_f18 = 0x2d;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  vStack_e10.m_value = (long)local_ce0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_e40);
  local_e40._0_8_ = local_158;
  local_e30.m_value = (long)local_578;
  local_e28.m_other = 2.07507571253324e-322;
  local_e20.m_expression = (NestedExpressionType)0x2;
  local_e18.m_value = 0x2d;
  vStack_e10.m_value = (long)local_ce0;
  local_f40._0_8_ =
       local_9b0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x84;
  local_f28.m_value = 0x2a;
  vStack_f20.m_value = 2;
  local_f18 = 0x2d;
  local_f30 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_f40,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_e40);
  local_f40 = (undefined1  [16])
              Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                        (local_ee0,(MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_9b0
                        );
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,3,1,8,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,45,3,0,45,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,3,1,8,3>> *)local_e40,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_45,_3,_0,_45,_3>,_0>_>
              *)local_f40);
  local_f40._0_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        *)local_e40;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,24,1,0,24,1>,0,Eigen::Stride<0,0>>>
            (local_ed8,
             (Map<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_0,_Eigen::Stride<0,_0>_> *)local_f40);
  return;
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalForcesContIntNoDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear material model (no damping).  For this style of method, the generalized internal force vector is
    // integrated across the volume of the element every time this calculation is performed. For this element, this is
    // likely more efficient than the "Pre-Integration" style calculation method.  Note that the integrand for the
    // generalize internal force vector for a straight and normalized element is of order : 8 in xi, 4 in eta, and 4 in
    // zeta. This requires GQ 5 points along the xi direction and 3 GQ points along the eta and zeta directions for
    // "Full Integration". However, very similar results can be obtained with fewer GQ point in each direction,
    // resulting in significantly fewer calculations.  Based on testing, this could be as low as 3x2x2

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // =============================================================================
    // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
    // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
    // will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31 ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32 ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33 ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31 ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32 ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33 ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.transpose() * e_bar.transpose();

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, first calculate the contribution to
    // the generalized internal force vector from the terms that do not include the Poisson effect.  This is integrated
    // across the entire volume of the element using the full number of Gauss quadrature points.
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (does not include the Poisson effect)
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) for efficiency. Since only the diagonal terms in the 6x6 stiffness matrix are
    // used, the 2nd Piola-Kirchoff stress can be calculated by simply scaling the vector of scaled Green-Lagrange
    // strains in Voight notation by the corresponding diagonal entry in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*E11 = D11*kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0.array() *= (0.5 * D0(0)) * m_kGQ_D0.array();

    // Each entry in SPK2_2 = D22*kGQ*E22 = D22*kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0.array() *= (0.5 * D0(1)) * m_kGQ_D0.array();

    // Each entry in SPK2_3 = D33*kGQ_D0*E33 = D33*kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0.array() *= (0.5 * D0(2)) * m_kGQ_D0.array();

    // Each entry in SPK2_4 = D44*kGQ*2*E23 = D44*kGQ*(F12*F13+F22*F23+F32*F33)
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0.array() *= D0(3) * m_kGQ_D0.array();

    // Each entry in SPK2_5 = D55*kGQ*2*E13 = D55*kGQ*(F11*F13+F21*F23+F31*F33)
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0.array() *= D0(4) * m_kGQ_D0.array();

    // Each entry in SPK2_6 = D66*kGQ*2*E12 = D66*(F11*F12+F21*F22+F31*F32)
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0.array() *= D0(5) * m_kGQ_D0.array();

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the Dv Blocks entries are calculated in a later step
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP_D0, 1>(0, 0) = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 1) = FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 2) = FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_5_Block_D0);

    P_Block.template block<NIP_D0, 1>(NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0);

    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_3_Block_D0);

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, second calculate the contribution to
    // the generalized internal force vector from the terms that include the Poisson effect.  This is integrated
    // across the entire volume of the element using Gauss quadrature points only along the beam axis.  It is assumed
    // that an isotropic material or orthotropic material aligned with its principle axes is used
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The combined result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) again for efficiency. Results are written in Voigt notation: epsilon =
    // [E11,E22,E33,2*E23,2*E13,2*E12] Note that with the material assumption being used, only [E11,E22,E33] need to be
    // calculated
    // =============================================================================

    // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv.array() *= 0.5 * m_kGQ_Dv.array();

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have already been scaled
    // by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point to make the
    // calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the D0 entries have already been calculated above
    // =============================================================================

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(SPK2_1_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).cwiseProduct(SPK2_2_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).cwiseProduct(SPK2_3_Block_Dv);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}